

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
::consume_operation::element_ptr(consume_operation *this)

{
  ControlBlock *pCVar1;
  uintptr_t uint_pointer;
  ControlBlock *pCVar2;
  
  pCVar2 = this->m_control;
  if (pCVar2 == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x408);
    pCVar2 = this->m_control;
  }
  pCVar1 = pCVar2 + 3;
  if ((pCVar2->m_next & 4) != 0) {
    pCVar1 = (ControlBlock *)pCVar1->m_next;
  }
  return pCVar1;
}

Assistant:

bool empty() const noexcept { return m_control == nullptr; }